

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  byte bVar1;
  U32 UVar2;
  uint uVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  uint uVar10;
  size_t sVar11;
  uint *puVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  U32 UVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  U32 *chainTable;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  
  uVar10 = (ms->cParams).minMatch;
  if (uVar10 - 6 < 2) {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar22 = 1 << (bVar1 & 0x1f);
    pUVar4 = ms->chainTable;
    pBVar5 = (ms->window).base;
    uVar10 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar2 = (ms->window).lowLimit;
    uVar17 = (uint)((long)ip - (long)pBVar5);
    UVar18 = uVar17 - uVar10;
    if (uVar17 - UVar2 <= uVar10) {
      UVar18 = UVar2;
    }
    if (ms->loadedDictEnd != 0) {
      UVar18 = UVar2;
    }
    uVar10 = (ms->window).dictLimit;
    uVar16 = (ms->cParams).searchLog;
    pZVar6 = ms->dictMatchState;
    pUVar7 = ms->hashTable;
    bVar13 = 0x40 - (char)(ms->cParams).hashLog;
    for (uVar20 = (ulong)ms->nextToUpdate; uVar20 < ((long)ip - (long)pBVar5 & 0xffffffffU);
        uVar20 = uVar20 + 1) {
      uVar24 = (ulong)(*(long *)(pBVar5 + uVar20) * -0x30e4432340650000) >> (bVar13 & 0x3f);
      pUVar4[(uint)uVar20 & ~(-1 << (bVar1 & 0x1f))] = pUVar7[uVar24];
      pUVar7[uVar24] = (uint)uVar20;
    }
    uVar21 = uVar17 - uVar22;
    if (uVar17 < uVar22) {
      uVar21 = 0;
    }
    ms->nextToUpdate = uVar17;
    puVar12 = pUVar7 + ((ulong)(*(long *)ip * -0x30e4432340650000) >> (bVar13 & 0x3f));
    uVar20 = 3;
    iVar23 = 1 << ((byte)uVar16 & 0x1f);
    while (iVar23 != 0) {
      uVar16 = *puVar12;
      if ((uVar16 < UVar18) ||
         (((((pBVar5 + uVar16)[uVar20] == ip[uVar20] &&
            (sVar11 = ZSTD_count(ip,pBVar5 + uVar16,iLimit), uVar20 < sVar11)) &&
           (*offsetPtr = (ulong)((uVar17 + 2) - uVar16), uVar20 = sVar11, ip + sVar11 == iLimit)) ||
          (uVar16 <= uVar21)))) break;
      puVar12 = pUVar4 + (uVar16 & uVar22 - 1);
      iVar23 = iVar23 + -1;
    }
    uVar16 = 1 << ((byte)(pZVar6->cParams).chainLog & 0x1f);
    pBVar8 = (pZVar6->window).nextSrc;
    pBVar9 = (pZVar6->window).base;
    uVar22 = (int)pBVar8 - (int)pBVar9;
    iVar14 = 0;
    uVar21 = uVar22 - uVar16;
    if (uVar22 < uVar16) {
      uVar21 = 0;
    }
    pUVar4 = pZVar6->chainTable;
    puVar12 = pZVar6->hashTable +
              ((ulong)(*(long *)ip * -0x30e4432340650000) >>
              (-(char)(pZVar6->cParams).hashLog & 0x3fU));
    uVar19 = (pZVar6->window).dictLimit;
    for (; iVar23 != iVar14; iVar14 = iVar14 + 1) {
      uVar3 = *puVar12;
      if (uVar3 < uVar19) {
        return uVar20;
      }
      if (*(int *)(pBVar9 + uVar3) == *(int *)ip) {
        sVar11 = ZSTD_count_2segments
                           (ip + 4,pBVar9 + (ulong)uVar3 + 4,iLimit,pBVar8,pBVar5 + uVar10);
        uVar24 = sVar11 + 4;
        if ((uVar20 < uVar24) &&
           (*offsetPtr = (ulong)((uVar22 + (uVar17 - uVar10) + 2) - uVar3), uVar20 = uVar24,
           ip + uVar24 == iLimit)) {
          return uVar24;
        }
      }
      if (uVar3 <= uVar21) {
        return uVar20;
      }
      puVar12 = pUVar4 + (uVar3 & uVar16 - 1);
    }
  }
  else if (uVar10 == 5) {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar21 = 1 << (bVar1 & 0x1f);
    pBVar5 = (ms->window).base;
    uVar22 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar10 = (ms->window).lowLimit;
    uVar16 = (uint)((long)ip - (long)pBVar5);
    uVar17 = uVar16 - uVar22;
    if (uVar16 - uVar10 <= uVar22) {
      uVar17 = uVar10;
    }
    pUVar4 = ms->chainTable;
    uVar22 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      uVar17 = uVar10;
    }
    uVar10 = (ms->cParams).searchLog;
    pZVar6 = ms->dictMatchState;
    pUVar7 = ms->hashTable;
    bVar13 = 0x40 - (char)(ms->cParams).hashLog;
    for (uVar20 = (ulong)ms->nextToUpdate; uVar20 < ((long)ip - (long)pBVar5 & 0xffffffffU);
        uVar20 = uVar20 + 1) {
      uVar24 = (ulong)(*(long *)(pBVar5 + uVar20) * -0x30e4432345000000) >> (bVar13 & 0x3f);
      pUVar4[(uint)uVar20 & ~(-1 << (bVar1 & 0x1f))] = pUVar7[uVar24];
      pUVar7[uVar24] = (uint)uVar20;
    }
    uVar19 = uVar16 - uVar21;
    if (uVar16 < uVar21) {
      uVar19 = 0;
    }
    ms->nextToUpdate = uVar16;
    puVar12 = pUVar7 + ((ulong)(*(long *)ip * -0x30e4432345000000) >> (bVar13 & 0x3f));
    uVar20 = 3;
    iVar23 = 1 << ((byte)uVar10 & 0x1f);
    while (iVar23 != 0) {
      uVar10 = *puVar12;
      if (((uVar10 < uVar17) ||
          ((((pBVar5 + uVar10)[uVar20] == ip[uVar20] &&
            (sVar11 = ZSTD_count(ip,pBVar5 + uVar10,iLimit), uVar20 < sVar11)) &&
           (*offsetPtr = (ulong)((uVar16 + 2) - uVar10), uVar20 = sVar11, ip + sVar11 == iLimit))))
         || (uVar10 <= uVar19)) break;
      puVar12 = pUVar4 + (uVar10 & uVar21 - 1);
      iVar23 = iVar23 + -1;
    }
    uVar17 = 1 << ((byte)(pZVar6->cParams).chainLog & 0x1f);
    pBVar8 = (pZVar6->window).nextSrc;
    pBVar9 = (pZVar6->window).base;
    uVar10 = (int)pBVar8 - (int)pBVar9;
    iVar14 = 0;
    uVar21 = uVar10 - uVar17;
    if (uVar10 < uVar17) {
      uVar21 = 0;
    }
    pUVar4 = pZVar6->chainTable;
    puVar12 = pZVar6->hashTable +
              ((ulong)(*(long *)ip * -0x30e4432345000000) >>
              (-(char)(pZVar6->cParams).hashLog & 0x3fU));
    uVar19 = (pZVar6->window).dictLimit;
    for (; iVar23 != iVar14; iVar14 = iVar14 + 1) {
      uVar3 = *puVar12;
      if (uVar3 < uVar19) {
        return uVar20;
      }
      if (*(int *)(pBVar9 + uVar3) == *(int *)ip) {
        sVar11 = ZSTD_count_2segments
                           (ip + 4,pBVar9 + (ulong)uVar3 + 4,iLimit,pBVar8,pBVar5 + uVar22);
        uVar24 = sVar11 + 4;
        if ((uVar20 < uVar24) &&
           (*offsetPtr = (ulong)((uVar10 + (uVar16 - uVar22) + 2) - uVar3), uVar20 = uVar24,
           ip + uVar24 == iLimit)) {
          return uVar24;
        }
      }
      if (uVar3 <= uVar21) {
        return uVar20;
      }
      puVar12 = pUVar4 + (uVar3 & uVar17 - 1);
    }
  }
  else {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar22 = 1 << (bVar1 & 0x1f);
    pBVar5 = (ms->window).base;
    uVar10 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar2 = (ms->window).lowLimit;
    uVar17 = (uint)((long)ip - (long)pBVar5);
    UVar18 = uVar17 - uVar10;
    if (uVar17 - UVar2 <= uVar10) {
      UVar18 = UVar2;
    }
    pUVar4 = ms->chainTable;
    uVar10 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      UVar18 = UVar2;
    }
    uVar16 = (ms->cParams).searchLog;
    pZVar6 = ms->dictMatchState;
    pUVar7 = ms->hashTable;
    bVar13 = 0x20 - (char)(ms->cParams).hashLog;
    for (uVar20 = (ulong)ms->nextToUpdate; uVar20 < ((long)ip - (long)pBVar5 & 0xffffffffU);
        uVar20 = uVar20 + 1) {
      uVar21 = (uint)(*(int *)(pBVar5 + uVar20) * -0x61c8864f) >> (bVar13 & 0x1f);
      pUVar4[(uint)uVar20 & ~(-1 << (bVar1 & 0x1f))] = pUVar7[uVar21];
      pUVar7[uVar21] = (uint)uVar20;
    }
    uVar21 = uVar17 - uVar22;
    if (uVar17 < uVar22) {
      uVar21 = 0;
    }
    ms->nextToUpdate = uVar17;
    iVar23 = *(int *)ip;
    uVar19 = iVar23 * -0x61c8864f;
    puVar12 = pUVar7 + (uVar19 >> (bVar13 & 0x1f));
    uVar20 = 3;
    iVar14 = 1 << ((byte)uVar16 & 0x1f);
    while (iVar14 != 0) {
      uVar16 = *puVar12;
      if (((uVar16 < UVar18) ||
          ((((pBVar5 + uVar16)[uVar20] == ip[uVar20] &&
            (sVar11 = ZSTD_count(ip,pBVar5 + uVar16,iLimit), uVar20 < sVar11)) &&
           (*offsetPtr = (ulong)((uVar17 + 2) - uVar16), uVar20 = sVar11, ip + sVar11 == iLimit))))
         || (uVar16 <= uVar21)) break;
      puVar12 = pUVar4 + (uVar16 & uVar22 - 1);
      iVar14 = iVar14 + -1;
    }
    uVar16 = 1 << ((byte)(pZVar6->cParams).chainLog & 0x1f);
    pBVar8 = (pZVar6->window).nextSrc;
    pBVar9 = (pZVar6->window).base;
    uVar22 = (int)pBVar8 - (int)pBVar9;
    iVar15 = 0;
    uVar21 = uVar22 - uVar16;
    if (uVar22 < uVar16) {
      uVar21 = 0;
    }
    pUVar4 = pZVar6->chainTable;
    puVar12 = pZVar6->hashTable + (uVar19 >> (-(char)(pZVar6->cParams).hashLog & 0x1fU));
    uVar19 = (pZVar6->window).dictLimit;
    for (; iVar14 != iVar15; iVar15 = iVar15 + 1) {
      uVar3 = *puVar12;
      if (uVar3 < uVar19) {
        return uVar20;
      }
      if (*(int *)(pBVar9 + uVar3) == iVar23) {
        sVar11 = ZSTD_count_2segments
                           (ip + 4,pBVar9 + (ulong)uVar3 + 4,iLimit,pBVar8,pBVar5 + uVar10);
        uVar24 = sVar11 + 4;
        if ((uVar20 < uVar24) &&
           (*offsetPtr = (ulong)((uVar22 + (uVar17 - uVar10) + 2) - uVar3), uVar20 = uVar24,
           ip + uVar24 == iLimit)) {
          return uVar24;
        }
      }
      if (uVar3 <= uVar21) {
        return uVar20;
      }
      puVar12 = pUVar4 + (uVar3 & uVar16 - 1);
    }
  }
  return uVar20;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dictMatchState);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dictMatchState);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dictMatchState);
    }
}